

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

char * __thiscall
viennamath::variable_index_out_of_bounds_exception::what
          (variable_index_out_of_bounds_exception *this)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1b8;
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,
             "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id="
             ,0x68);
  poVar1 = std::ostream::_M_insert<long>((long)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", vector_size=",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return (char *)local_1b8;
}

Assistant:

const char * what() const throw()
    {
      std::stringstream ss;
      ss << "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id=" << id_ << ", vector_size=" << vector_size_ << std::endl;
      return ss.str().c_str();
    }